

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

void __thiscall IlmThread_3_2::ThreadPool::Data::setProvider(Data *this,ProviderPtr *provider)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_locker __lock;
  _Sp_locker local_3a [2];
  element_type *local_38;
  
  local_38 = (provider->
             super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  p_Var1 = (provider->
           super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::_Sp_locker::_Sp_locker(local_3a,this);
  peVar2 = (this->_provider).
           super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->_provider).
            super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->_provider).
  super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38;
  (this->_provider).
  super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  std::_Sp_locker::~_Sp_locker(local_3a);
  if ((peVar2 != (element_type *)0x0) &&
     (peVar2 != (provider->
                super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)) {
    (*peVar2->_vptr_ThreadPoolProvider[5])(peVar2);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void setProvider (ProviderPtr provider)
    {
        ProviderPtr curp = std::atomic_exchange (&_provider, provider);
        if (curp && curp != provider) curp->finish ();
    }